

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int AF_A_KillTracer(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *pAVar1;
  DObject *this;
  AActor *source_00;
  PClassActor *filter_00;
  int flags_00;
  AActor *killtarget;
  bool bVar2;
  bool local_8b;
  bool local_86;
  bool local_83;
  FName local_80;
  FName local_7c;
  AActor *local_78;
  AActor *inflictor;
  AActor *source;
  int local_60;
  int inflict;
  int src;
  FName species;
  MetaClass *filter;
  int flags;
  FName damagetype;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    pAVar1 = (AActor *)(param->field_0).field_1.a;
    local_83 = true;
    if (pAVar1 != (AActor *)0x0) {
      local_83 = DObject::IsKindOf((DObject *)pAVar1,AActor::RegistrationInfo.MyClass);
    }
    if (local_83 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
        bVar2 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_86 = true;
      if (this != (DObject *)0x0) {
        local_86 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_86 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
      _flags = (void *)0x0;
    }
    else {
      bVar2 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
        bVar2 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      _flags = param[2].field_0.field_1.a;
    }
    FName::FName((FName *)((long)&filter + 4));
    if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
      FName::operator=((FName *)((long)&filter + 4),NAME_None);
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193a,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      FName::operator=((FName *)((long)&filter + 4),param[3].field_0.i);
    }
    if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
      filter._0_4_ = 0;
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193b,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      filter._0_4_ = param[4].field_0.i;
    }
    if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
      _src = (PClassActor *)0x0;
    }
    else {
      bVar2 = false;
      if ((param[5].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[5].field_0.field_1.atag != 1)) {
        bVar2 = param[5].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193c,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      _src = (PClassActor *)param[5].field_0.field_1.a;
      local_8b = true;
      if (_src != (PClassActor *)0x0) {
        local_8b = PClass::IsDescendantOf((PClass *)_src,AActor::RegistrationInfo.MyClass);
      }
      if (local_8b == false) {
        __assert_fail("filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193c,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    FName::FName((FName *)&inflict);
    if ((numparam < 7) || (param[6].field_0.field_3.Type == 0xff)) {
      FName::operator=((FName *)&inflict,NAME_None);
    }
    else {
      if (param[6].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193d,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      FName::operator=((FName *)&inflict,param[6].field_0.i);
    }
    if ((numparam < 8) || (param[7].field_0.field_3.Type == 0xff)) {
      local_60 = 0;
    }
    else {
      if (param[7].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193e,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      local_60 = param[7].field_0.i;
    }
    if ((numparam < 9) || (param[8].field_0.field_3.Type == 0xff)) {
      source._4_4_ = 0;
    }
    else {
      if (param[8].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x193f,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      source._4_4_ = param[8].field_0.i;
    }
    inflictor = COPY_AAPTR(pAVar1,local_60);
    local_78 = COPY_AAPTR(pAVar1,source._4_4_);
    bVar2 = TObjPtr<AActor>::operator!=(&pAVar1->tracer,(AActor *)0x0);
    if (bVar2) {
      killtarget = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&pAVar1->tracer);
      source_00 = inflictor;
      pAVar1 = local_78;
      FName::FName(&local_7c,(FName *)((long)&filter + 4));
      flags_00 = (int)filter;
      filter_00 = _src;
      FName::FName(&local_80,(FName *)&inflict);
      DoKill(killtarget,pAVar1,source_00,&local_7c,flags_00,filter_00,&local_80);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x1939,"int AF_A_KillTracer(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillTracer)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->tracer != NULL)
		DoKill(self->tracer, inflictor, source, damagetype, flags, filter, species);
	return 0;
}